

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O1

int ifr_count_tiles(igsc_device_handle *handle)

{
  FILE *__stream;
  uint uVar1;
  undefined4 uVar2;
  undefined8 uVar3;
  int iVar4;
  long in_FS_OFFSET;
  uint16_t supported_tiles;
  ushort local_2a;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = 3;
  do {
    uVar1 = igsc_ifr_count_tiles(handle,&local_2a);
    if (uVar1 != 0xd) break;
    usleep(2000000);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  if (uVar1 == 0) {
    iVar4 = 0;
    printf("Number of supported tiles: %u\n",(ulong)local_2a);
  }
  else {
    if (quiet == '\0') {
      fprintf(_stderr,"Error: Failed to run ifr count tiles, library return code %d\n",(ulong)uVar1)
      ;
    }
    __stream = _stdout;
    iVar4 = 1;
    if (quiet == '\0') {
      uVar2 = igsc_get_last_firmware_status(handle);
      uVar3 = igsc_translate_firmware_status(uVar2);
      uVar1 = igsc_get_last_firmware_status(handle);
      fprintf(__stream,"Firmware status: %s (0x%x)\n",uVar3,(ulong)uVar1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

mockable_static
int ifr_count_tiles(struct igsc_device_handle *handle)
{
    int ret;
    uint16_t supported_tiles;
    unsigned int retries = 0;

    /* call the igsc library routine to run ifr count tiles */
    while ((ret = igsc_ifr_count_tiles(handle, &supported_tiles)) == IGSC_ERROR_BUSY)
    {
        gsc_msleep(CONNECT_RETRIES_SLEEP_MSEC);
        if (++retries >= MAX_CONNECT_RETRIES)
            break;
    }
    if (ret)
    {
        fwupd_error("Failed to run ifr count tiles, library return code %d\n", ret);
        print_device_fw_status(handle);
        return EXIT_FAILURE;
    }

    printf("Number of supported tiles: %u\n", supported_tiles);

    return ret;
}